

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O2

int bgzf_check_EOF(BGZF *fp)

{
  hFILE *fp_00;
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  off_t oVar5;
  ssize_t sVar6;
  int *piVar7;
  uint uVar8;
  uint8_t buf [28];
  
  fp_00 = fp->fp;
  lVar1 = fp_00->offset;
  pcVar2 = fp_00->begin;
  pcVar3 = fp_00->buffer;
  uVar8 = 2;
  oVar5 = hseek(fp_00,-0x1c,2);
  if (oVar5 < 0) {
    piVar7 = __errno_location();
    if (*piVar7 == 0x1d) {
      fp->fp->has_errno = 0;
    }
    else {
      uVar8 = 0xffffffff;
    }
  }
  else {
    sVar6 = hread(fp->fp,buf,0x1c);
    uVar8 = 0xffffffff;
    if (sVar6 == 0x1c) {
      oVar5 = hseek(fp->fp,(off_t)(pcVar2 + (lVar1 - (long)pcVar3)),0);
      if (-1 < oVar5) {
        iVar4 = bcmp(anon_var_dwarf_254c1,buf,0x1c);
        uVar8 = (uint)(iVar4 == 0);
      }
    }
  }
  return uVar8;
}

Assistant:

int bgzf_check_EOF(BGZF *fp)
{
    uint8_t buf[28];
    off_t offset = htell(fp->fp);
    if (hseek(fp->fp, -28, SEEK_END) < 0) {
        if (errno == ESPIPE) { hclearerr(fp->fp); return 2; }
        else return -1;
    }
    if ( hread(fp->fp, buf, 28) != 28 ) return -1;
    if ( hseek(fp->fp, offset, SEEK_SET) < 0 ) return -1;
    return (memcmp("\037\213\010\4\0\0\0\0\0\377\6\0\102\103\2\0\033\0\3\0\0\0\0\0\0\0\0\0", buf, 28) == 0)? 1 : 0;
}